

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O1

int pt_evt_find_header_fup(pt_packet *packet,pt_packet_decoder *pacdec)

{
  pt_packet_type pVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  pt_packet_decoder decoder;
  pt_packet_decoder local_150;
  
  iVar3 = -1;
  if (pacdec != (pt_packet_decoder *)0x0 && packet != (pt_packet *)0x0) {
    memcpy(&local_150,pacdec,0x128);
    iVar4 = iVar3;
    do {
      iVar3 = pt_pkt_next(&local_150,packet,0x18);
      if (iVar3 < 0) {
        bVar2 = false;
      }
      else {
        pVar1 = packet->type;
        if (pVar1 < ppt_exstop) {
          if ((0x27f805U >> (pVar1 & (ppt_evd|ppt_psb)) & 1) == 0) {
            if ((0x100010U >> (pVar1 & (ppt_evd|ppt_psb)) & 1) == 0) {
              if (pVar1 != ppt_fup) goto LAB_00107d29;
              iVar3 = 1;
              goto LAB_00107d2e;
            }
            bVar2 = false;
            iVar3 = 0;
          }
          else {
            bVar2 = true;
            iVar3 = iVar4;
          }
        }
        else {
LAB_00107d29:
          iVar3 = -6;
LAB_00107d2e:
          bVar2 = false;
        }
      }
      iVar4 = iVar3;
    } while (bVar2);
  }
  return iVar3;
}

Assistant:

static int pt_evt_find_header_fup(struct pt_packet *packet,
				  const struct pt_packet_decoder *pacdec)
{
	struct pt_packet_decoder decoder;

	if (!packet || !pacdec)
		return -pte_internal;

	decoder = *pacdec;
	for (;;) {
		int errcode;

		errcode = pt_pkt_next(&decoder, packet, sizeof(*packet));
		if (errcode < 0)
			return errcode;

		switch (packet->type) {
		case ppt_fup:
			/* Found it. */
			return 1;

		case ppt_mode:
		case ppt_pip:
		case ppt_vmcs:
		case ppt_mnt:
		case ppt_tsc:
		case ppt_cbr:
		case ppt_tma:
		case ppt_mtc:
		case ppt_cyc:
		case ppt_pad:
		case ppt_invalid:
			/* Ignore the packet. */
			break;

		case ppt_psbend:
		case ppt_ovf:
			/* There's no FUP in here. */
			return 0;

		default:
			return -pte_bad_context;
		}
	}
}